

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_sin_m68k(floatx80 a,float_status *status)

{
  floatx80 *pfVar1;
  char cVar2;
  char cVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined8 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined8 uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  float32 a_00;
  ulong uVar13;
  undefined4 uVar14;
  uint a_01;
  uint uVar15;
  uint uVar16;
  int iVar17;
  floatx80 fVar18;
  floatx80 fVar19;
  floatx80 fVar20;
  floatx80 fVar21;
  floatx80 fVar22;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 a_31;
  floatx80 a_32;
  floatx80 a_33;
  floatx80 a_34;
  floatx80 a_35;
  floatx80 a_36;
  floatx80 a_37;
  floatx80 a_38;
  floatx80 a_39;
  floatx80 a_40;
  floatx80 a_41;
  floatx80 a_42;
  floatx80 a_43;
  floatx80 a_44;
  floatx80 a_45;
  floatx80 a_46;
  floatx80 a_47;
  floatx80 a_48;
  floatx80 a_49;
  floatx80 a_50;
  floatx80 a_51;
  floatx80 a_52;
  floatx80 a_53;
  floatx80 a_54;
  floatx80 a_55;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  floatx80 b_34;
  floatx80 b_35;
  floatx80 b_36;
  floatx80 b_37;
  floatx80 b_38;
  floatx80 b_39;
  floatx80 b_40;
  floatx80 b_41;
  floatx80 b_42;
  floatx80 b_43;
  floatx80 b_44;
  floatx80 b_45;
  floatx80 b_46;
  floatx80 b_47;
  floatx80 b_48;
  floatx80 b_49;
  floatx80 b_50;
  floatx80 b_51;
  floatx80 b_52;
  undefined4 local_70;
  uint64_t local_60;
  
  uVar11 = a.low;
  uVar16 = a._8_4_;
  auVar4 = a._0_12_;
  if ((~uVar16 & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      a_02._12_4_ = 0;
      a_02.low = auVar4._0_8_;
      a_02.high = auVar4._8_2_;
      a_02._10_2_ = auVar4._10_2_;
      fVar18 = propagateFloatx80NaNOneArg(a_02,status);
      return fVar18;
    }
    float_raise_m68k('\x01',status);
    fVar18 = floatx80_default_nan_m68k(status);
    return fVar18;
  }
  if (uVar11 == 0 && ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    uVar10 = 0;
    goto LAB_006f150b;
  }
  cVar2 = status->float_rounding_mode;
  cVar3 = status->floatx80_rounding_precision;
  status->float_rounding_mode = '\0';
  status->floatx80_rounding_precision = 'P';
  uVar15 = (uVar16 & 0x7fff) * 0x10000;
  if (uVar15 + a.low._6_2_ + 0xbffb4381 < 0xffd2c381) {
    uVar15 = uVar15 | a.low._6_2_;
    if (0x3fff8000 < uVar15) {
      if (uVar15 == 0x7ffeffff) {
        iVar17 = (uVar16 & 0xffff8000) - 0x24;
        a_03._12_4_ = 0;
        a_03.low = auVar4._0_8_;
        a_03.high = auVar4._8_2_;
        a_03._10_2_ = auVar4._10_2_;
        b._8_4_ = (uVar16 & 0xffff8000) - 2;
        b.low = 0xc90fdaa200000000;
        b._12_4_ = 0;
        fVar18 = floatx80_add_m68k(a_03,b,status);
        auVar4 = fVar18._0_12_;
        a_04._12_4_ = 0;
        a_04.low = auVar4._0_8_;
        a_04.high = auVar4._8_2_;
        a_04._10_2_ = auVar4._10_2_;
        b_00._8_4_ = iVar17;
        b_00.low = 0x85a308d300000000;
        b_00._12_4_ = 0;
        fVar18 = floatx80_add_m68k(a_04,b_00,status);
        uVar11 = fVar18.low;
        uVar16 = fVar18._8_4_;
        a_05._12_4_ = 0;
        a_05.low = auVar4._0_8_;
        a_05.high = auVar4._8_2_;
        a_05._10_2_ = auVar4._10_2_;
        auVar4 = fVar18._0_12_;
        b_01._12_4_ = 0;
        b_01.low = auVar4._0_8_;
        b_01.high = auVar4._8_2_;
        b_01._10_2_ = auVar4._10_2_;
        fVar18 = floatx80_sub_m68k(a_05,b_01,status);
        auVar4 = fVar18._0_12_;
        a_06._12_4_ = 0;
        a_06.low = auVar4._0_8_;
        a_06.high = auVar4._8_2_;
        a_06._10_2_ = auVar4._10_2_;
        b_02._8_4_ = iVar17;
        b_02.low = 0x85a308d300000000;
        b_02._12_4_ = 0;
        fVar18 = floatx80_add_m68k(a_06,b_02,status);
        auVar4 = fVar18._0_12_;
      }
      else {
        auVar4 = SUB1612(ZEXT816(0),0);
      }
      local_60 = auVar4._0_8_;
      local_70 = auVar4._8_4_;
      while( true ) {
        uVar15 = uVar16 & 0x7fff;
        iVar17 = uVar15 - 0x401a;
        if (uVar15 < 0x401c) {
          iVar17 = 0;
        }
        b_06._8_4_ = 0x3ffe - iVar17;
        a_01 = (uVar16 & 0x8000) << 0x10 | 0x5f000000;
        a_08._8_4_ = uVar16;
        a_08.low = uVar11;
        a_08._12_4_ = 0;
        b_06.low = 0xa2f9836e4e44152a;
        b_06._12_4_ = 0;
        fVar18 = floatx80_mul_m68k(a_08,b_06,status);
        fVar19 = float32_to_floatx80_m68k(a_01,status);
        b_07._8_8_ = fVar19._8_8_ & 0xffffffff;
        auVar4 = fVar18._0_12_;
        a_09._12_4_ = 0;
        a_09.low = auVar4._0_8_;
        a_09.high = auVar4._8_2_;
        a_09._10_2_ = auVar4._10_2_;
        b_07.low = fVar19.low;
        fVar18 = floatx80_add_m68k(a_09,b_07,status);
        fVar19 = float32_to_floatx80_m68k(a_01,status);
        b_08._8_8_ = fVar19._8_8_ & 0xffffffff;
        auVar4 = fVar18._0_12_;
        a_10._12_4_ = 0;
        a_10.low = auVar4._0_8_;
        a_10.high = auVar4._8_2_;
        a_10._10_2_ = auVar4._10_2_;
        b_08.low = fVar19.low;
        fVar18 = floatx80_sub_m68k(a_10,b_08,status);
        a_11._8_4_ = iVar17 + 0x3fff;
        a_11.low = 0xc90fdaa200000000;
        a_11._12_4_ = 0;
        auVar4 = fVar18._0_12_;
        b_09._12_4_ = 0;
        b_09.low = auVar4._0_8_;
        b_09.high = auVar4._8_2_;
        b_09._10_2_ = auVar4._10_2_;
        fVar18 = floatx80_mul_m68k(a_11,b_09,status);
        a_12._8_4_ = iVar17 + 0x3fdd;
        a_12.low = 0x85a308d300000000;
        a_12._12_4_ = 0;
        b_10._12_4_ = 0;
        b_10.low = auVar4._0_8_;
        b_10.high = auVar4._8_2_;
        b_10._10_2_ = auVar4._10_2_;
        fVar19 = floatx80_mul_m68k(a_12,b_10,status);
        b_11._8_8_ = fVar19._8_8_ & 0xffffffff;
        auVar5 = fVar18._0_12_;
        a_13._12_4_ = 0;
        a_13.low = auVar5._0_8_;
        a_13.high = auVar5._8_2_;
        a_13._10_2_ = auVar5._10_2_;
        b_11.low = fVar19.low;
        fVar18 = floatx80_add_m68k(a_13,b_11,status);
        a_14._12_4_ = 0;
        a_14.low = auVar5._0_8_;
        a_14.high = auVar5._8_2_;
        a_14._10_2_ = auVar5._10_2_;
        auVar5 = fVar18._0_12_;
        b_12._12_4_ = 0;
        b_12.low = auVar5._0_8_;
        b_12.high = auVar5._8_2_;
        b_12._10_2_ = auVar5._10_2_;
        fVar18 = floatx80_sub_m68k(a_14,b_12,status);
        a_15._8_4_ = uVar16;
        a_15.low = uVar11;
        a_15._12_4_ = 0;
        b_13._12_4_ = 0;
        b_13.low = auVar5._0_8_;
        b_13.high = auVar5._8_2_;
        b_13._10_2_ = auVar5._10_2_;
        fVar20 = floatx80_sub_m68k(a_15,b_13,status);
        auVar5 = fVar18._0_12_;
        a_16._12_4_ = 0;
        a_16.low = auVar5._0_8_;
        a_16.high = auVar5._8_2_;
        a_16._10_2_ = auVar5._10_2_;
        auVar5 = fVar19._0_12_;
        b_14._12_4_ = 0;
        b_14.low = auVar5._0_8_;
        b_14.high = auVar5._8_2_;
        b_14._10_2_ = auVar5._10_2_;
        fVar18 = floatx80_add_m68k(a_16,b_14,status);
        b_15._8_8_ = fVar18._8_8_ & 0xffffffff;
        a_17._8_4_ = local_70;
        a_17.low = local_60;
        a_17._12_4_ = 0;
        b_15.low = fVar18.low;
        fVar18 = floatx80_sub_m68k(a_17,b_15,status);
        auVar5 = fVar20._0_12_;
        a_18._12_4_ = 0;
        a_18.low = auVar5._0_8_;
        a_18.high = auVar5._8_2_;
        a_18._10_2_ = auVar5._10_2_;
        auVar6 = fVar18._0_12_;
        b_16._12_4_ = 0;
        b_16.low = auVar6._0_8_;
        b_16.high = auVar6._8_2_;
        b_16._10_2_ = auVar6._10_2_;
        fVar18 = floatx80_add_m68k(a_18,b_16,status);
        uVar11 = fVar18.low;
        uVar16 = fVar18._8_4_;
        if (uVar15 < 0x401c) break;
        a_19._12_4_ = 0;
        a_19.low = auVar5._0_8_;
        a_19.high = auVar5._8_2_;
        a_19._10_2_ = auVar5._10_2_;
        auVar4 = fVar18._0_12_;
        b_17._12_4_ = 0;
        b_17.low = auVar4._0_8_;
        b_17.high = auVar4._8_2_;
        b_17._10_2_ = auVar4._10_2_;
        fVar18 = floatx80_sub_m68k(a_19,b_17,status);
        b_18._8_8_ = fVar18._8_8_ & 0xffffffff;
        a_20._12_4_ = 0;
        a_20.low = auVar6._0_8_;
        a_20.high = auVar6._8_2_;
        a_20._10_2_ = auVar6._10_2_;
        b_18.low = fVar18.low;
        fVar18 = floatx80_add_m68k(a_20,b_18,status);
        local_60 = fVar18.low;
        local_70 = fVar18._8_4_;
      }
      a_21._12_4_ = 0;
      a_21.low = auVar4._0_8_;
      a_21.high = auVar4._8_2_;
      a_21._10_2_ = auVar4._10_2_;
      uVar15 = floatx80_to_int32_m68k(a_21,status);
      goto LAB_006f0fe3;
    }
    float32_to_floatx80_m68k(0x3f800000,status);
    status->float_rounding_mode = cVar2;
    status->floatx80_rounding_precision = cVar3;
    a_07._12_4_ = 0;
    a_07.low = auVar4._0_8_;
    a_07.high = auVar4._8_2_;
    a_07._10_2_ = auVar4._10_2_;
    fVar18 = floatx80_move_m68k(a_07,status);
    auVar4 = fVar18._0_12_;
  }
  else {
    fVar18 = float64_to_floatx80_m68k(0x3fe45f306dc9c883,status);
    b_03._8_8_ = fVar18._8_8_ & 0xffffffff;
    fVar19._12_4_ = 0;
    fVar19.low = auVar4._0_8_;
    fVar19.high = auVar4._8_2_;
    fVar19._10_2_ = auVar4._10_2_;
    b_03.low = fVar18.low;
    fVar18 = floatx80_mul_m68k(fVar19,b_03,status);
    auVar5 = fVar18._0_12_;
    fVar18._12_4_ = 0;
    fVar18.low = auVar5._0_8_;
    fVar18.high = auVar5._8_2_;
    fVar18._10_2_ = auVar5._10_2_;
    uVar15 = floatx80_to_int32_m68k(fVar18,status);
    pfVar1 = pi_tbl + (long)(int)uVar15 + 0x20;
    uVar7 = pfVar1->low;
    uVar8 = pfVar1->high;
    uVar9 = *(undefined2 *)&pfVar1->field_0xa;
    b_04._10_2_ = uVar9;
    b_04.high = uVar8;
    b_04.low = uVar7;
    fVar20._12_4_ = 0;
    fVar20.low = auVar4._0_8_;
    fVar20.high = auVar4._8_2_;
    fVar20._10_2_ = auVar4._10_2_;
    b_04._12_4_ = 0;
    fVar18 = floatx80_sub_m68k(fVar20,b_04,status);
    fVar19 = float32_to_floatx80_m68k(pi_tbl2[(long)(int)uVar15 + 0x20],status);
    b_05._8_8_ = fVar19._8_8_ & 0xffffffff;
    auVar4 = fVar18._0_12_;
    fVar21._12_4_ = 0;
    fVar21.low = auVar4._0_8_;
    fVar21.high = auVar4._8_2_;
    fVar21._10_2_ = auVar4._10_2_;
    b_05.low = fVar19.low;
    fVar18 = floatx80_sub_m68k(fVar21,b_05,status);
    uVar11 = fVar18.low;
    uVar16 = fVar18._8_4_;
LAB_006f0fe3:
    if ((uVar15 & 1) == 0) {
      a_22._8_4_ = uVar16;
      a_22.low = uVar11;
      a_22._12_4_ = 0;
      b_19._8_4_ = uVar16;
      b_19.low = uVar11;
      b_19._12_4_ = 0;
      fVar18 = floatx80_mul_m68k(a_22,b_19,status);
      b_20._8_8_ = fVar18._8_8_ & 0xffffffff;
      a_23._8_8_ = fVar18._8_8_ & 0xffffffff;
      a_23.low = fVar18.low;
      b_20.low = fVar18.low;
      fVar19 = floatx80_mul_m68k(a_23,b_20,status);
      fVar20 = float64_to_floatx80_m68k(0xbd6aaa77ccc994f5,status);
      fVar21 = float64_to_floatx80_m68k(0x3de612097aae8da1,status);
      auVar4 = fVar20._0_12_;
      a_24._12_4_ = 0;
      a_24.low = auVar4._0_8_;
      a_24.high = auVar4._8_2_;
      a_24._10_2_ = auVar4._10_2_;
      auVar4 = fVar19._0_12_;
      b_21._12_4_ = 0;
      b_21.low = auVar4._0_8_;
      b_21.high = auVar4._8_2_;
      b_21._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_24,b_21,status);
      auVar5 = fVar21._0_12_;
      a_25._12_4_ = 0;
      a_25.low = auVar5._0_8_;
      a_25.high = auVar5._8_2_;
      a_25._10_2_ = auVar5._10_2_;
      b_22._12_4_ = 0;
      b_22.low = auVar4._0_8_;
      b_22.high = auVar4._8_2_;
      b_22._10_2_ = auVar4._10_2_;
      fVar20 = floatx80_mul_m68k(a_25,b_22,status);
      fVar21 = float64_to_floatx80_m68k(0xbe5ae6452a118ae4,status);
      b_23._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar5 = fVar19._0_12_;
      a_26._12_4_ = 0;
      a_26.low = auVar5._0_8_;
      a_26.high = auVar5._8_2_;
      a_26._10_2_ = auVar5._10_2_;
      b_23.low = fVar21.low;
      fVar19 = floatx80_add_m68k(a_26,b_23,status);
      fVar21 = float64_to_floatx80_m68k(0x3ec71de3a5341531,status);
      b_24._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar5 = fVar20._0_12_;
      a_27._12_4_ = 0;
      a_27.low = auVar5._0_8_;
      a_27.high = auVar5._8_2_;
      a_27._10_2_ = auVar5._10_2_;
      b_24.low = fVar21.low;
      fVar20 = floatx80_add_m68k(a_27,b_24,status);
      auVar5 = fVar19._0_12_;
      a_28._12_4_ = 0;
      a_28.low = auVar5._0_8_;
      a_28.high = auVar5._8_2_;
      a_28._10_2_ = auVar5._10_2_;
      b_25._12_4_ = 0;
      b_25.low = auVar4._0_8_;
      b_25.high = auVar4._8_2_;
      b_25._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_28,b_25,status);
      auVar5 = fVar20._0_12_;
      a_29._12_4_ = 0;
      a_29.low = auVar5._0_8_;
      a_29.high = auVar5._8_2_;
      a_29._10_2_ = auVar5._10_2_;
      b_26._12_4_ = 0;
      b_26.low = auVar4._0_8_;
      b_26.high = auVar4._8_2_;
      b_26._10_2_ = auVar4._10_2_;
      fVar20 = floatx80_mul_m68k(a_29,b_26,status);
      fVar21 = float64_to_floatx80_m68k(0xbf2a01a01a018b59,status);
      b_27._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar5 = fVar19._0_12_;
      a_30._12_4_ = 0;
      a_30.low = auVar5._0_8_;
      a_30.high = auVar5._8_2_;
      a_30._10_2_ = auVar5._10_2_;
      b_27.low = fVar21.low;
      fVar19 = floatx80_add_m68k(a_30,b_27,status);
      auVar5 = fVar20._0_12_;
      a_31._12_4_ = 0;
      a_31.low = auVar5._0_8_;
      a_31.high = auVar5._8_2_;
      a_31._10_2_ = auVar5._10_2_;
      b_28._8_8_ = 0x3ff8;
      b_28.low = 0x88888888888859af;
      fVar20 = floatx80_add_m68k(a_31,b_28,status);
      a_32._12_4_ = 0;
      a_32.low = auVar4._0_8_;
      a_32.high = auVar4._8_2_;
      a_32._10_2_ = auVar4._10_2_;
      auVar4 = fVar19._0_12_;
      b_29._12_4_ = 0;
      b_29.low = auVar4._0_8_;
      b_29.high = auVar4._8_2_;
      b_29._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_32,b_29,status);
      auVar4 = fVar20._0_12_;
      a_33._12_4_ = 0;
      a_33.low = auVar4._0_8_;
      a_33.high = auVar4._8_2_;
      a_33._10_2_ = auVar4._10_2_;
      auVar4 = fVar18._0_12_;
      b_30._12_4_ = 0;
      b_30.low = auVar4._0_8_;
      b_30.high = auVar4._8_2_;
      b_30._10_2_ = auVar4._10_2_;
      fVar18 = floatx80_mul_m68k(a_33,b_30,status);
      auVar5 = fVar19._0_12_;
      a_34._12_4_ = 0;
      a_34.low = auVar5._0_8_;
      a_34.high = auVar5._8_2_;
      a_34._10_2_ = auVar5._10_2_;
      b_31._8_8_ = 0xbffc;
      b_31.low = 0xaaaaaaaaaaaaaa99;
      fVar19 = floatx80_add_m68k(a_34,b_31,status);
      auVar5 = fVar19._0_12_;
      a_35._12_4_ = 0;
      a_35.low = auVar5._0_8_;
      a_35.high = auVar5._8_2_;
      a_35._10_2_ = auVar5._10_2_;
      auVar5 = fVar18._0_12_;
      b_32._12_4_ = 0;
      b_32.low = auVar5._0_8_;
      b_32.high = auVar5._8_2_;
      b_32._10_2_ = auVar5._10_2_;
      fVar18 = floatx80_add_m68k(a_35,b_32,status);
      uVar16 = uVar16 & 0xffff8000 ^ uVar15 << 0xe | uVar16 & 0x7fff;
      a_36._12_4_ = 0;
      a_36.low = auVar4._0_8_;
      a_36.high = auVar4._8_2_;
      a_36._10_2_ = auVar4._10_2_;
      b_33._8_4_ = uVar16;
      b_33.low = uVar11;
      b_33._12_4_ = 0;
      fVar19 = floatx80_mul_m68k(a_36,b_33,status);
      auVar4 = fVar19._0_12_;
      a_37._12_4_ = 0;
      a_37.low = auVar4._0_8_;
      a_37.high = auVar4._8_2_;
      a_37._10_2_ = auVar4._10_2_;
      auVar4 = fVar18._0_12_;
      b_34._12_4_ = 0;
      b_34.low = auVar4._0_8_;
      b_34.high = auVar4._8_2_;
      b_34._10_2_ = auVar4._10_2_;
      fVar18 = floatx80_mul_m68k(a_37,b_34,status);
      uVar12 = fVar18.low;
      status->float_rounding_mode = cVar2;
      status->floatx80_rounding_precision = cVar3;
      uVar14 = fVar18._8_4_;
      uVar13 = (ulong)uVar16;
    }
    else {
      a_38._8_4_ = uVar16;
      a_38.low = uVar11;
      a_38._12_4_ = 0;
      b_35._8_4_ = uVar16;
      b_35.low = uVar11;
      b_35._12_4_ = 0;
      fVar18 = floatx80_mul_m68k(a_38,b_35,status);
      uVar11 = fVar18.low;
      b_36._8_8_ = fVar18._8_8_ & 0xffffffff;
      a_39._8_8_ = fVar18._8_8_ & 0xffffffff;
      a_39.low = uVar11;
      b_36.low = uVar11;
      fVar19 = floatx80_mul_m68k(a_39,b_36,status);
      fVar20 = float64_to_floatx80_m68k(0x3d2ac4d0d6011ee3,status);
      fVar21 = float64_to_floatx80_m68k(0xbda9396f9f45ac19,status);
      a_00 = 0xbf800000;
      if ((uVar15 & 2) == 0) {
        a_00 = 0x3f800000;
      }
      auVar4 = fVar20._0_12_;
      a_40._12_4_ = 0;
      a_40.low = auVar4._0_8_;
      a_40.high = auVar4._8_2_;
      a_40._10_2_ = auVar4._10_2_;
      auVar4 = fVar19._0_12_;
      b_37._12_4_ = 0;
      b_37.low = auVar4._0_8_;
      b_37.high = auVar4._8_2_;
      b_37._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_40,b_37,status);
      auVar5 = fVar21._0_12_;
      a_41._12_4_ = 0;
      a_41.low = auVar5._0_8_;
      a_41.high = auVar5._8_2_;
      a_41._10_2_ = auVar5._10_2_;
      b_38._12_4_ = 0;
      b_38.low = auVar4._0_8_;
      b_38.high = auVar4._8_2_;
      b_38._10_2_ = auVar4._10_2_;
      fVar20 = floatx80_mul_m68k(a_41,b_38,status);
      fVar21 = float64_to_floatx80_m68k(0x3e21eed90612c972,status);
      b_39._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar5 = fVar19._0_12_;
      a_42._12_4_ = 0;
      a_42.low = auVar5._0_8_;
      a_42.high = auVar5._8_2_;
      a_42._10_2_ = auVar5._10_2_;
      b_39.low = fVar21.low;
      fVar19 = floatx80_add_m68k(a_42,b_39,status);
      fVar21 = float64_to_floatx80_m68k(0xbe927e4fb79d9fcf,status);
      b_40._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar5 = fVar20._0_12_;
      a_43._12_4_ = 0;
      a_43.low = auVar5._0_8_;
      a_43.high = auVar5._8_2_;
      a_43._10_2_ = auVar5._10_2_;
      b_40.low = fVar21.low;
      fVar20 = floatx80_add_m68k(a_43,b_40,status);
      auVar5 = fVar19._0_12_;
      a_44._12_4_ = 0;
      a_44.low = auVar5._0_8_;
      a_44.high = auVar5._8_2_;
      a_44._10_2_ = auVar5._10_2_;
      b_41._12_4_ = 0;
      b_41.low = auVar4._0_8_;
      b_41.high = auVar4._8_2_;
      b_41._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_44,b_41,status);
      auVar5 = fVar20._0_12_;
      a_45._12_4_ = 0;
      a_45.low = auVar5._0_8_;
      a_45.high = auVar5._8_2_;
      a_45._10_2_ = auVar5._10_2_;
      b_42._12_4_ = 0;
      b_42.low = auVar4._0_8_;
      b_42.high = auVar4._8_2_;
      b_42._10_2_ = auVar4._10_2_;
      fVar20 = floatx80_mul_m68k(a_45,b_42,status);
      fVar21 = float64_to_floatx80_m68k(0x3efa01a01a01d423,status);
      b_43._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar5 = fVar19._0_12_;
      a_46._12_4_ = 0;
      a_46.low = auVar5._0_8_;
      a_46.high = auVar5._8_2_;
      a_46._10_2_ = auVar5._10_2_;
      b_43.low = fVar21.low;
      fVar19 = floatx80_add_m68k(a_46,b_43,status);
      auVar5 = fVar20._0_12_;
      a_47._12_4_ = 0;
      a_47.low = auVar5._0_8_;
      a_47.high = auVar5._8_2_;
      a_47._10_2_ = auVar5._10_2_;
      b_44._8_8_ = 0xbff5;
      b_44.low = 0xb60b60b60b61d438;
      fVar20 = floatx80_add_m68k(a_47,b_44,status);
      auVar5 = fVar19._0_12_;
      a_48._12_4_ = 0;
      a_48.low = auVar5._0_8_;
      a_48.high = auVar5._8_2_;
      a_48._10_2_ = auVar5._10_2_;
      b_45._12_4_ = 0;
      b_45.low = auVar4._0_8_;
      b_45.high = auVar4._8_2_;
      b_45._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_48,b_45,status);
      a_49._12_4_ = 0;
      a_49.low = auVar4._0_8_;
      a_49.high = auVar4._8_2_;
      a_49._10_2_ = auVar4._10_2_;
      auVar4 = fVar20._0_12_;
      b_46._12_4_ = 0;
      b_46.low = auVar4._0_8_;
      b_46.high = auVar4._8_2_;
      b_46._10_2_ = auVar4._10_2_;
      fVar20 = floatx80_mul_m68k(a_49,b_46,status);
      auVar4 = fVar19._0_12_;
      a_50._12_4_ = 0;
      a_50.low = auVar4._0_8_;
      a_50.high = auVar4._8_2_;
      a_50._10_2_ = auVar4._10_2_;
      b_47._8_8_ = 0x3ffa;
      b_47.low = 0xaaaaaaaaaaaaab5e;
      fVar19 = floatx80_add_m68k(a_50,b_47,status);
      fVar21 = float32_to_floatx80_m68k(0xbf000000,status);
      b_48._8_8_ = fVar21._8_8_ & 0xffffffff;
      auVar4 = fVar20._0_12_;
      a_51._12_4_ = 0;
      a_51.low = auVar4._0_8_;
      a_51.high = auVar4._8_2_;
      a_51._10_2_ = auVar4._10_2_;
      b_48.low = fVar21.low;
      fVar20 = floatx80_add_m68k(a_51,b_48,status);
      auVar4 = fVar18._0_12_;
      a_52._12_4_ = 0;
      a_52.low = auVar4._0_8_;
      a_52.high = auVar4._8_2_;
      a_52._10_2_ = auVar4._10_2_;
      auVar4 = fVar19._0_12_;
      b_49._12_4_ = 0;
      b_49.low = auVar4._0_8_;
      b_49.high = auVar4._8_2_;
      b_49._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_mul_m68k(a_52,b_49,status);
      auVar4 = fVar19._0_12_;
      a_53._12_4_ = 0;
      a_53.low = auVar4._0_8_;
      a_53.high = auVar4._8_2_;
      a_53._10_2_ = auVar4._10_2_;
      auVar4 = fVar20._0_12_;
      b_50._12_4_ = 0;
      b_50.low = auVar4._0_8_;
      b_50.high = auVar4._8_2_;
      b_50._10_2_ = auVar4._10_2_;
      fVar19 = floatx80_add_m68k(a_53,b_50,status);
      b_51._8_4_ = (uVar15 & 0xfffffffe) << 0xe ^ fVar18._8_4_;
      auVar4 = fVar19._0_12_;
      a_54._12_4_ = 0;
      a_54.low = auVar4._0_8_;
      a_54.high = auVar4._8_2_;
      a_54._10_2_ = auVar4._10_2_;
      b_51.low = uVar11;
      b_51._12_4_ = 0;
      fVar18 = floatx80_mul_m68k(a_54,b_51,status);
      uVar12 = fVar18.low;
      uVar14 = fVar18._8_4_;
      status->float_rounding_mode = cVar2;
      status->floatx80_rounding_precision = cVar3;
      fVar18 = float32_to_floatx80_m68k(a_00,status);
      uVar11 = fVar18.low;
      uVar13 = fVar18._8_8_ & 0xffffffff;
    }
    a_55._8_4_ = uVar14;
    a_55.low = uVar12;
    a_55._12_4_ = 0;
    b_52._8_8_ = uVar13;
    b_52.low = uVar11;
    fVar18 = floatx80_add_m68k(a_55,b_52,status);
    auVar4 = fVar18._0_12_;
  }
  uVar10 = auVar4._0_8_;
  uVar16 = auVar4._8_4_;
  float_raise_m68k(' ',status);
LAB_006f150b:
  fVar22._8_4_ = uVar16;
  fVar22.low = uVar10;
  fVar22._12_4_ = 0;
  return fVar22;
}

Assistant:

floatx80 floatx80_sin(floatx80 a, float_status *status)
{
    flag aSign, xSign;
    int32_t aExp, xExp;
    uint64_t aSig, xSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, l, n, j;
    floatx80 fp0, fp1, fp2, fp3, fp4, fp5, x, invtwopi, twopi1, twopi2;
    float32 posneg1, twoto63;
    flag endflag;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    fp0 = a;

    if (compact < 0x3FD78000 || compact > 0x4004BC7E) {
        /* 2^(-40) > |X| > 15 PI */
        if (compact > 0x3FFF8000) { /* |X| >= 15 PI */
            /* REDUCEX */
            fp1 = packFloatx80(0, 0, 0);
            if (compact == 0x7FFEFFFF) {
                twopi1 = packFloatx80(aSign ^ 1, 0x7FFE,
                                      UINT64_C(0xC90FDAA200000000));
                twopi2 = packFloatx80(aSign ^ 1, 0x7FDC,
                                      UINT64_C(0x85A308D300000000));
                fp0 = floatx80_add(fp0, twopi1, status);
                fp1 = fp0;
                fp0 = floatx80_add(fp0, twopi2, status);
                fp1 = floatx80_sub(fp1, fp0, status);
                fp1 = floatx80_add(fp1, twopi2, status);
            }
        loop:
            xSign = extractFloatx80Sign(fp0);
            xExp = extractFloatx80Exp(fp0);
            xExp -= 0x3FFF;
            if (xExp <= 28) {
                l = 0;
                endflag = 1;
            } else {
                l = xExp - 27;
                endflag = 0;
            }
            invtwopi = packFloatx80(0, 0x3FFE - l,
                                    UINT64_C(0xA2F9836E4E44152A)); /* INVTWOPI */
            twopi1 = packFloatx80(0, 0x3FFF + l, UINT64_C(0xC90FDAA200000000));
            twopi2 = packFloatx80(0, 0x3FDD + l, UINT64_C(0x85A308D300000000));

            /* SIGN(INARG)*2^63 IN SGL */
            twoto63 = packFloat32(xSign, 0xBE, 0);

            fp2 = floatx80_mul(fp0, invtwopi, status);
            fp2 = floatx80_add(fp2, float32_to_floatx80(twoto63, status),
                               status); /* THE FRACT PART OF FP2 IS ROUNDED */
            fp2 = floatx80_sub(fp2, float32_to_floatx80(twoto63, status),
                               status); /* FP2 is N */
            fp4 = floatx80_mul(twopi1, fp2, status); /* W = N*P1 */
            fp5 = floatx80_mul(twopi2, fp2, status); /* w = N*P2 */
            fp3 = floatx80_add(fp4, fp5, status); /* FP3 is P */
            fp4 = floatx80_sub(fp4, fp3, status); /* W-P */
            fp0 = floatx80_sub(fp0, fp3, status); /* FP0 is A := R - P */
            fp4 = floatx80_add(fp4, fp5, status); /* FP4 is p = (W-P)+w */
            fp3 = fp0; /* FP3 is A */
            fp1 = floatx80_sub(fp1, fp4, status); /* FP1 is a := r - p */
            fp0 = floatx80_add(fp0, fp1, status); /* FP0 is R := A+a */

            if (endflag > 0) {
                n = floatx80_to_int32(fp2, status);
                goto sincont;
            }
            fp3 = floatx80_sub(fp3, fp0, status); /* A-R */
            fp1 = floatx80_add(fp1, fp3, status); /* FP1 is r := (A-R)+a */
            goto loop;
        } else {
            /* SINSM */
            fp0 = float32_to_floatx80(make_float32(0x3F800000),
                                      status); /* 1 */

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            /* SINTINY */
            a = floatx80_move(a, status);
            float_raise(float_flag_inexact, status);

            return a;
        }
    } else {
        fp1 = floatx80_mul(fp0, float64_to_floatx80(
                           make_float64(0x3FE45F306DC9C883), status),
                           status); /* X*2/PI */

        n = floatx80_to_int32(fp1, status);
        j = 32 + n;

        fp0 = floatx80_sub(fp0, pi_tbl[j], status); /* X-Y1 */
        fp0 = floatx80_sub(fp0, float32_to_floatx80(pi_tbl2[j], status),
                           status); /* FP0 IS R = (X-Y1)-Y2 */

    sincont:
        if (n & 1) {
            /* COSPOLY */
            fp0 = floatx80_mul(fp0, fp0, status); /* FP0 IS S */
            fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS T */
            fp2 = float64_to_floatx80(make_float64(0x3D2AC4D0D6011EE3),
                                      status); /* B8 */
            fp3 = float64_to_floatx80(make_float64(0xBDA9396F9F45AC19),
                                      status); /* B7 */

            xSign = extractFloatx80Sign(fp0); /* X IS S */
            xExp = extractFloatx80Exp(fp0);
            xSig = extractFloatx80Frac(fp0);

            if ((n >> 1) & 1) {
                xSign ^= 1;
                posneg1 = make_float32(0xBF800000); /* -1 */
            } else {
                xSign ^= 0;
                posneg1 = make_float32(0x3F800000); /* 1 */
            } /* X IS NOW R'= SGN*R */

            fp2 = floatx80_mul(fp2, fp1, status); /* TB8 */
            fp3 = floatx80_mul(fp3, fp1, status); /* TB7 */
            fp2 = floatx80_add(fp2, float64_to_floatx80(
                               make_float64(0x3E21EED90612C972), status),
                               status); /* B6+TB8 */
            fp3 = floatx80_add(fp3, float64_to_floatx80(
                               make_float64(0xBE927E4FB79D9FCF), status),
                               status); /* B5+TB7 */
            fp2 = floatx80_mul(fp2, fp1, status); /* T(B6+TB8) */
            fp3 = floatx80_mul(fp3, fp1, status); /* T(B5+TB7) */
            fp2 = floatx80_add(fp2, float64_to_floatx80(
                               make_float64(0x3EFA01A01A01D423), status),
                               status); /* B4+T(B6+TB8) */
            fp4 = packFloatx80(1, 0x3FF5, UINT64_C(0xB60B60B60B61D438));
            fp3 = floatx80_add(fp3, fp4, status); /* B3+T(B5+TB7) */
            fp2 = floatx80_mul(fp2, fp1, status); /* T(B4+T(B6+TB8)) */
            fp1 = floatx80_mul(fp1, fp3, status); /* T(B3+T(B5+TB7)) */
            fp4 = packFloatx80(0, 0x3FFA, UINT64_C(0xAAAAAAAAAAAAAB5E));
            fp2 = floatx80_add(fp2, fp4, status); /* B2+T(B4+T(B6+TB8)) */
            fp1 = floatx80_add(fp1, float32_to_floatx80(
                               make_float32(0xBF000000), status),
                               status); /* B1+T(B3+T(B5+TB7)) */
            fp0 = floatx80_mul(fp0, fp2, status); /* S(B2+T(B4+T(B6+TB8))) */
            fp0 = floatx80_add(fp0, fp1, status); /* [B1+T(B3+T(B5+TB7))]+
                                                   * [S(B2+T(B4+T(B6+TB8)))]
                                                   */

            x = packFloatx80(xSign, xExp, xSig);
            fp0 = floatx80_mul(fp0, x, status);

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_add(fp0, float32_to_floatx80(posneg1, status), status);

            float_raise(float_flag_inexact, status);

            return a;
        } else {
            /* SINPOLY */
            xSign = extractFloatx80Sign(fp0); /* X IS R */
            xExp = extractFloatx80Exp(fp0);
            xSig = extractFloatx80Frac(fp0);

            xSign ^= (n >> 1) & 1; /* X IS NOW R'= SGN*R */

            fp0 = floatx80_mul(fp0, fp0, status); /* FP0 IS S */
            fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS T */
            fp3 = float64_to_floatx80(make_float64(0xBD6AAA77CCC994F5),
                                      status); /* A7 */
            fp2 = float64_to_floatx80(make_float64(0x3DE612097AAE8DA1),
                                      status); /* A6 */
            fp3 = floatx80_mul(fp3, fp1, status); /* T*A7 */
            fp2 = floatx80_mul(fp2, fp1, status); /* T*A6 */
            fp3 = floatx80_add(fp3, float64_to_floatx80(
                               make_float64(0xBE5AE6452A118AE4), status),
                               status); /* A5+T*A7 */
            fp2 = floatx80_add(fp2, float64_to_floatx80(
                               make_float64(0x3EC71DE3A5341531), status),
                               status); /* A4+T*A6 */
            fp3 = floatx80_mul(fp3, fp1, status); /* T(A5+TA7) */
            fp2 = floatx80_mul(fp2, fp1, status); /* T(A4+TA6) */
            fp3 = floatx80_add(fp3, float64_to_floatx80(
                               make_float64(0xBF2A01A01A018B59), status),
                               status); /* A3+T(A5+TA7) */
            fp4 = packFloatx80(0, 0x3FF8, UINT64_C(0x88888888888859AF));
            fp2 = floatx80_add(fp2, fp4, status); /* A2+T(A4+TA6) */
            fp1 = floatx80_mul(fp1, fp3, status); /* T(A3+T(A5+TA7)) */
            fp2 = floatx80_mul(fp2, fp0, status); /* S(A2+T(A4+TA6)) */
            fp4 = packFloatx80(1, 0x3FFC, UINT64_C(0xAAAAAAAAAAAAAA99));
            fp1 = floatx80_add(fp1, fp4, status); /* A1+T(A3+T(A5+TA7)) */
            fp1 = floatx80_add(fp1, fp2,
                               status); /* [A1+T(A3+T(A5+TA7))]+
                                         * [S(A2+T(A4+TA6))]
                                         */

            x = packFloatx80(xSign, xExp, xSig);
            fp0 = floatx80_mul(fp0, x, status); /* R'*S */
            fp0 = floatx80_mul(fp0, fp1, status); /* SIN(R')-R' */

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_add(fp0, x, status);

            float_raise(float_flag_inexact, status);

            return a;
        }
    }
}